

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiViewport * ImGui::FindViewportByPlatformHandle(void *platform_handle)

{
  uint uVar1;
  ImGuiViewportP *pIVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = (GImGui->Viewports).Size;
  if ((ulong)uVar1 != 0) {
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    uVar4 = 0;
    do {
      if (uVar3 == uVar4) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                      ,0x706,"T &ImVector<ImGuiViewportP *>::operator[](int) [T = ImGuiViewportP *]"
                     );
      }
      pIVar2 = (GImGui->Viewports).Data[uVar4];
      if ((pIVar2->super_ImGuiViewport).PlatformHandle == platform_handle) {
        return &pIVar2->super_ImGuiViewport;
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  return (ImGuiViewport *)0x0;
}

Assistant:

ImGuiViewport* ImGui::FindViewportByPlatformHandle(void* platform_handle)
{
    ImGuiContext& g = *GImGui;
    for (int i = 0; i != g.Viewports.Size; i++)
        if (g.Viewports[i]->PlatformHandle == platform_handle)
            return g.Viewports[i];
    return NULL;
}